

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_copy_lambda(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict lambda)

{
  sexp_conflict psVar1;
  long in_RCX;
  undefined8 in_RDI;
  sexp_conflict res;
  
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(in_RDI,0x60,0x1c);
  (psVar1->value).flonum = *(double *)(in_RCX + 8);
  (psVar1->value).type.cpl = *(sexp *)(in_RCX + 0x10);
  (psVar1->value).type.slots = *(sexp *)(in_RCX + 0x18);
  (psVar1->value).type.setters = *(sexp *)(in_RCX + 0x28);
  (psVar1->value).type.print = *(sexp *)(in_RCX + 0x38);
  (psVar1->value).type.dl = *(sexp *)(in_RCX + 0x40);
  (psVar1->value).type.getters = *(sexp *)(in_RCX + 0x20);
  (psVar1->value).type.finalize_name = *(sexp *)(in_RCX + 0x48);
  (psVar1->value).port.size = *(size_t *)(in_RCX + 0x50);
  return psVar1;
}

Assistant:

sexp sexp_copy_lambda (sexp ctx, sexp self, sexp_sint_t n, sexp lambda) {
  sexp res = sexp_alloc_type(ctx, lambda, SEXP_LAMBDA);
  sexp_lambda_name(res) = sexp_lambda_name(lambda);
  sexp_lambda_params(res) = sexp_lambda_params(lambda);
  sexp_lambda_body(res) = sexp_lambda_body(lambda);
  sexp_lambda_locals(res) = sexp_lambda_locals(lambda);
  sexp_lambda_fv(res) = sexp_lambda_fv(lambda);
  sexp_lambda_sv(res) = sexp_lambda_sv(lambda);
  sexp_lambda_defs(res) = sexp_lambda_defs(lambda);
  sexp_lambda_return_type(res) = sexp_lambda_return_type(lambda);
  sexp_lambda_param_types(res) = sexp_lambda_param_types(lambda);
  return res;
}